

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_23::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  int iVar1;
  IMutableContext *pIVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  
  pIVar2 = getCurrentMutableContext();
  iVar1 = (*(pIVar2->super_IContext)._vptr_IContext[4])(pIVar2);
  poVar3 = (ostream *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                     ((long *)CONCAT44(extraout_var,iVar1));
  poVar3 = std::operator<<(poVar3,'\x1b');
  std::operator<<(poVar3,(char *)this);
  std::ostream::flush();
  return;
}

Assistant:

void setColour(const char *_escapeCode) {
                // The escape sequence must be flushed to console, otherwise if
                // stdin and stderr are intermixed, we'd get accidentally coloured output.
                getCurrentContext().getConfig()->stream()
                    << '\033' << _escapeCode << std::flush;
            }